

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O3

MiddleVal * __thiscall FinalParser::term(MiddleVal *__return_storage_ptr__,FinalParser *this)

{
  MiddleVal *pMVar1;
  int iVar2;
  _Alloc_hider _Var3;
  string tk;
  string local_110;
  string local_f0;
  MiddleVal local_d0;
  string local_a0;
  MiddleVal local_80;
  string local_50;
  
  factor(__return_storage_ptr__,this);
  getnow_abi_cxx11_(&local_a0,this);
  do {
    iVar2 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar2 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        return __return_storage_ptr__;
      }
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar2 == 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"*","");
      match(this,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      factor(&local_d0,this);
      MiddleVal::operator*=(__return_storage_ptr__,&local_d0);
      pMVar1 = &local_d0;
      _Var3._M_p = local_d0.Type._M_dataplus._M_p;
    }
    else {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
      match(this,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      factor(&local_80,this);
      MiddleVal::operator/=(__return_storage_ptr__,&local_80);
      pMVar1 = &local_80;
      _Var3._M_p = local_80.Type._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &(pMVar1->Type).field_2) {
      operator_delete(_Var3._M_p);
    }
    getnow_abi_cxx11_(&local_50,this);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

MiddleVal FinalParser::term() {
    MiddleVal temp = factor();
    std::string tk = getnow();
    while (tk == "*" || tk == "/") {
        if (tk == "*") {
            match("*");
            temp *= factor();
        } else {
            match("/");
            temp /= factor();
        }
        tk = getnow();
    }
    return temp;
}